

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

string * __thiscall
BamTools::Internal::BamReaderPrivate::GetErrorString_abi_cxx11_(BamReaderPrivate *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x228));
  return in_RDI;
}

Assistant:

string BamReaderPrivate::GetErrorString(void) const {
    return m_errorString;
}